

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::TiledOutputFile::copyPixels(TiledOutputFile *this,TiledInputFile *in)

{
  LineOrder LVar1;
  Compression CVar2;
  LevelMode LVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  Header *this_00;
  TileDescription *this_01;
  TileDescription *other;
  Box2i *this_02;
  Box2i *src;
  LineOrder *pLVar9;
  Compression *pCVar10;
  ChannelList *this_03;
  ChannelList *other_00;
  Data *pDVar11;
  ostream *poVar12;
  char *pcVar13;
  LogicExc *this_04;
  ArgExc *pAVar14;
  int i_l;
  int iVar15;
  size_type __n;
  int i_lx;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  TileCoord TVar19;
  int ly;
  int lx;
  int dy;
  int dx;
  int pixelDataSize;
  pthread_mutex_t *local_218;
  char *pixelData;
  vector<int,_std::allocator<int>_> ly_table;
  vector<int,_std::allocator<int>_> lx_table;
  vector<int,_std::allocator<int>_> dy_table;
  vector<int,_std::allocator<int>_> dx_table;
  
  local_218 = (pthread_mutex_t *)this->_streamData;
  std::mutex::lock((mutex *)&local_218->__data);
  pDVar11 = this->_data;
  this_00 = TiledInputFile::header(in);
  bVar4 = Header::hasTileDescription(&pDVar11->header);
  if (bVar4) {
    bVar4 = Header::hasTileDescription(this_00);
    if (bVar4) {
      this_01 = Header::tileDescription(&pDVar11->header);
      other = Header::tileDescription(this_00);
      bVar4 = TileDescription::operator==(this_01,other);
      if (!bVar4) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
        poVar12 = std::operator<<((ostream *)
                                  &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = TiledInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" failed. The files have different tile descriptions.");
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
        __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      this_02 = Header::dataWindow(&pDVar11->header);
      src = Header::dataWindow(this_00);
      bVar4 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::operator==(this_02,src);
      if (!bVar4) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
        poVar12 = std::operator<<((ostream *)
                                  &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Cannot copy pixels from image file \"");
        pcVar13 = TiledInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\". The files have different data windows.");
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
        __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pLVar9 = Header::lineOrder(&pDVar11->header);
      LVar1 = *pLVar9;
      pLVar9 = Header::lineOrder(this_00);
      if (LVar1 != *pLVar9) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
        poVar12 = std::operator<<((ostream *)
                                  &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = TiledInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" failed. The files have different line orders.");
        pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
        __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      pCVar10 = Header::compression(&pDVar11->header);
      CVar2 = *pCVar10;
      pCVar10 = Header::compression(this_00);
      if (CVar2 == *pCVar10) {
        this_03 = Header::channels(&pDVar11->header);
        other_00 = Header::channels(this_00);
        bVar4 = ChannelList::operator==(this_03,other_00);
        if (!bVar4) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
          poVar12 = std::operator<<((ostream *)
                                    &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage,
                                    "Quick pixel copy from image file \"");
          pcVar13 = TiledInputFile::fileName(in);
          poVar12 = std::operator<<(poVar12,pcVar13);
          poVar12 = std::operator<<(poVar12,"\" to image file \"");
          pcVar13 = fileName(this);
          poVar12 = std::operator<<(poVar12,pcVar13);
          std::operator<<(poVar12,"\" failed.  The files have different channel lists.");
          pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
          __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        bVar4 = TileOffsets::isEmpty(&this->_data->tileOffsets);
        if (bVar4) {
          pDVar11 = this->_data;
          LVar3 = (pDVar11->tileDesc).mode;
          if (LVar3 < RIPMAP_LEVELS) {
            iVar15 = 0;
            uVar17 = 0;
            while( true ) {
              iVar5 = numLevels(this);
              if (iVar5 <= iVar15) break;
              iVar5 = numXTiles(this,iVar15);
              iVar6 = numYTiles(this,iVar15);
              uVar17 = uVar17 + iVar6 * iVar5;
              iVar15 = iVar15 + 1;
            }
            pDVar11 = this->_data;
          }
          else {
            if (LVar3 != RIPMAP_LEVELS) {
              pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
              Iex_3_4::ArgExc::ArgExc(pAVar14,"Unknown LevelMode format.");
              __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
            }
            uVar17 = 0;
            for (iVar15 = 0; iVar15 < pDVar11->numYLevels; iVar15 = iVar15 + 1) {
              for (iVar5 = 0; iVar5 < pDVar11->numXLevels; iVar5 = iVar5 + 1) {
                iVar6 = numXTiles(this,iVar5);
                iVar8 = numYTiles(this,iVar15);
                uVar17 = uVar17 + iVar8 * iVar6;
                pDVar11 = this->_data;
              }
            }
          }
          LVar1 = pDVar11->lineOrder;
          uVar7 = 1;
          if (LVar1 == RANDOM_Y) {
            uVar7 = uVar17;
          }
          __n = (size_type)(int)uVar7;
          std::vector<int,_std::allocator<int>_>::vector(&dx_table,__n,(allocator_type *)&dy_table);
          std::vector<int,_std::allocator<int>_>::vector(&dy_table,__n,(allocator_type *)&lx_table);
          std::vector<int,_std::allocator<int>_>::vector(&lx_table,__n,(allocator_type *)&ly_table);
          std::vector<int,_std::allocator<int>_>::vector(&ly_table,__n,(allocator_type *)&pixelData)
          ;
          if (LVar1 == RANDOM_Y) {
            TiledInputFile::tileOrder
                      (in,dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                       dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
            pDVar11 = this->_data;
            (pDVar11->nextTileToWrite).dx =
                 *dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
            (pDVar11->nextTileToWrite).dy =
                 *dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
            (pDVar11->nextTileToWrite).lx =
                 *lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
            (pDVar11->nextTileToWrite).ly =
                 *ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
          }
          uVar16 = 0;
          uVar18 = (ulong)uVar17;
          if ((int)uVar17 < 1) {
            uVar18 = uVar16;
          }
          for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
            pDVar11 = this->_data;
            dx = (pDVar11->nextTileToWrite).dx;
            dy = (pDVar11->nextTileToWrite).dy;
            lx = (pDVar11->nextTileToWrite).lx;
            ly = (pDVar11->nextTileToWrite).ly;
            TiledInputFile::rawTileData(in,&dx,&dy,&lx,&ly,&pixelData,&pixelDataSize);
            anon_unknown_6::writeTileData
                      (this->_streamData,this->_data,dx,dy,lx,ly,pixelData,pixelDataSize);
            if (LVar1 == RANDOM_Y) {
              if ((long)uVar16 < (long)(int)(uVar17 - 1)) {
                pDVar11 = this->_data;
                (pDVar11->nextTileToWrite).dx =
                     dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16 + 1];
                (pDVar11->nextTileToWrite).dy =
                     dy_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16 + 1];
                (pDVar11->nextTileToWrite).lx =
                     lx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16 + 1];
                (pDVar11->nextTileToWrite).ly =
                     ly_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16 + 1];
              }
            }
            else {
              TVar19 = Data::nextTileCoord(this->_data,&this->_data->nextTileToWrite);
              this->_data->nextTileToWrite = TVar19;
            }
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&ly_table.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&lx_table.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&dy_table.super__Vector_base<int,_std::allocator<int>_>);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&dx_table.super__Vector_base<int,_std::allocator<int>_>);
          pthread_mutex_unlock(local_218);
          return;
        }
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
        poVar12 = std::operator<<((ostream *)
                                  &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage,
                                  "Quick pixel copy from image file \"");
        pcVar13 = TiledInputFile::fileName(in);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" to image file \"");
        pcVar13 = OStream::fileName(this->_streamData->os);
        poVar12 = std::operator<<(poVar12,pcVar13);
        poVar12 = std::operator<<(poVar12,"\" failed. \"");
        pcVar13 = fileName(this);
        poVar12 = std::operator<<(poVar12,pcVar13);
        std::operator<<(poVar12,"\" already contains pixel data.");
        this_04 = (LogicExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::LogicExc::LogicExc(this_04,(stringstream *)&dx_table);
        __cxa_throw(this_04,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
      }
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
      poVar12 = std::operator<<((ostream *)
                                &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,
                                "Quick pixel copy from image file \"");
      pcVar13 = TiledInputFile::fileName(in);
      poVar12 = std::operator<<(poVar12,pcVar13);
      poVar12 = std::operator<<(poVar12,"\" to image file \"");
      pcVar13 = fileName(this);
      poVar12 = std::operator<<(poVar12,pcVar13);
      std::operator<<(poVar12,"\" failed. The files use different compression methods.");
      pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
      __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&dx_table);
  poVar12 = std::operator<<((ostream *)
                            &dx_table.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,
                            "Cannot perform a quick pixel copy from image file \"");
  pcVar13 = TiledInputFile::fileName(in);
  poVar12 = std::operator<<(poVar12,pcVar13);
  poVar12 = std::operator<<(poVar12,"\" to image file \"");
  pcVar13 = fileName(this);
  poVar12 = std::operator<<(poVar12,pcVar13);
  std::operator<<(poVar12,
                  "\".  The output file is tiled, but the input file is not.  Try using OutputFile::copyPixels() instead."
                 );
  pAVar14 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(pAVar14,(stringstream *)&dx_table);
  __cxa_throw(pAVar14,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledOutputFile::copyPixels (TiledInputFile& in)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_streamData);
#endif
    //
    // Check if this file's and and the InputFile's
    // headers are compatible.
    //

    const Header& hdr   = _data->header;
    const Header& inHdr = in.header ();

    if (!hdr.hasTileDescription () || !inHdr.hasTileDescription ())
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot perform a quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\".  The "
                   "output file is tiled, but the input file is not.  "
                   "Try using OutputFile::copyPixels() instead.");

    if (!(hdr.tileDescription () == inHdr.tileDescription ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different tile descriptions.");

    if (!(hdr.dataWindow () == inHdr.dataWindow ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot copy pixels from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\". The "
                   "files have different data windows.");

    if (!(hdr.lineOrder () == inHdr.lineOrder ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files have different line orders.");

    if (!(hdr.compression () == inHdr.compression ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" failed. "
                   "The files use different compression methods.");

    if (!(hdr.channels () == inHdr.channels ()))
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << fileName ()
                << "\" "
                   "failed.  The files have different channel "
                   "lists.");

    //
    // Verify that no pixel data have been written to this file yet.
    //

    if (!_data->tileOffsets.isEmpty ())
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Quick pixel copy from image "
            "file \""
                << in.fileName ()
                << "\" to image "
                   "file \""
                << _streamData->os->fileName ()
                << "\" "
                   "failed. \""
                << fileName ()
                << "\" "
                   "already contains pixel data.");

    //
    // Calculate the total number of tiles in the file
    //

    int numAllTiles = 0;

    switch (levelMode ())
    {
        case ONE_LEVEL:
        case MIPMAP_LEVELS:

            for (int i_l = 0; i_l < numLevels (); ++i_l)
                numAllTiles += numXTiles (i_l) * numYTiles (i_l);

            break;

        case RIPMAP_LEVELS:

            for (int i_ly = 0; i_ly < numYLevels (); ++i_ly)
                for (int i_lx = 0; i_lx < numXLevels (); ++i_lx)
                    numAllTiles += numXTiles (i_lx) * numYTiles (i_ly);

            break;

        default: throw IEX_NAMESPACE::ArgExc ("Unknown LevelMode format.");
    }

    bool random_y = _data->lineOrder == RANDOM_Y;

    std::vector<int> dx_table (random_y ? numAllTiles : 1);
    std::vector<int> dy_table (random_y ? numAllTiles : 1);
    std::vector<int> lx_table (random_y ? numAllTiles : 1);
    std::vector<int> ly_table (random_y ? numAllTiles : 1);

    if (random_y)
    {
        in.tileOrder (&dx_table[0], &dy_table[0], &lx_table[0], &ly_table[0]);
        _data->nextTileToWrite.dx = dx_table[0];
        _data->nextTileToWrite.dy = dy_table[0];
        _data->nextTileToWrite.lx = lx_table[0];
        _data->nextTileToWrite.ly = ly_table[0];
    }

    for (int i = 0; i < numAllTiles; ++i)
    {
        const char* pixelData;
        int         pixelDataSize;

        int dx = _data->nextTileToWrite.dx;
        int dy = _data->nextTileToWrite.dy;
        int lx = _data->nextTileToWrite.lx;
        int ly = _data->nextTileToWrite.ly;

        in.rawTileData (dx, dy, lx, ly, pixelData, pixelDataSize);
        writeTileData (
            _streamData, _data, dx, dy, lx, ly, pixelData, pixelDataSize);

        if (random_y)
        {
            if (i < numAllTiles - 1)
            {
                _data->nextTileToWrite.dx = dx_table[i + 1];
                _data->nextTileToWrite.dy = dy_table[i + 1];
                _data->nextTileToWrite.lx = lx_table[i + 1];
                _data->nextTileToWrite.ly = ly_table[i + 1];
            }
        }
        else
        {
            _data->nextTileToWrite =
                _data->nextTileCoord (_data->nextTileToWrite);
        }
    }
}